

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensembletobin.cpp
# Opt level: O2

void ensembletobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  Ensemble q;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d",&q,&q.ensemble_id);
    if (iVar1 != 2) break;
    fwrite(&q,8,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
  return;
}

Assistant:

void doit() {

    Ensemble q;
    char line[4096];
    int lineno = 0;
    fgets(line, sizeof(line), stdin);   // Read column headings
    lineno++;

    // Read data
    while(fgets(line, sizeof(line), stdin) != 0) {
      if (sscanf(line, "%d,%d", &q.sidx, &q.ensemble_id) != 2) {

	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
	return;

      } else {

	fwrite(&q, sizeof(q), 1, stdout);

      }
      lineno++;
    }

  }